

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendValue(JsonString *p,sqlite3_value *pValue)

{
  int iVar1;
  u32 uVar2;
  uint uVar3;
  uchar *puVar4;
  u32 n_1;
  char *z_1;
  u32 n;
  char *z;
  sqlite3_value *pValue_local;
  JsonString *p_local;
  
  iVar1 = sqlite3_value_type(pValue);
  if (iVar1 - 1U < 2) {
    puVar4 = sqlite3_value_text(pValue);
    uVar2 = sqlite3_value_bytes(pValue);
    jsonAppendRaw(p,(char *)puVar4,uVar2);
  }
  else if (iVar1 == 3) {
    puVar4 = sqlite3_value_text(pValue);
    uVar2 = sqlite3_value_bytes(pValue);
    uVar3 = sqlite3_value_subtype(pValue);
    if (uVar3 == 0x4a) {
      jsonAppendRaw(p,(char *)puVar4,uVar2);
    }
    else {
      jsonAppendString(p,(char *)puVar4,uVar2);
    }
  }
  else if (iVar1 == 5) {
    jsonAppendRaw(p,"null",4);
  }
  else if (p->bErr == '\0') {
    sqlite3_result_error(p->pCtx,"JSON cannot hold BLOB values",-1);
    p->bErr = '\x02';
    jsonReset(p);
  }
  return;
}

Assistant:

static void jsonAppendValue(
  JsonString *p,                 /* Append to this JSON string */
  sqlite3_value *pValue          /* Value to append */
){
  switch( sqlite3_value_type(pValue) ){
    case SQLITE_NULL: {
      jsonAppendRaw(p, "null", 4);
      break;
    }
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      jsonAppendRaw(p, z, n);
      break;
    }
    case SQLITE_TEXT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      if( sqlite3_value_subtype(pValue)==JSON_SUBTYPE ){
        jsonAppendRaw(p, z, n);
      }else{
        jsonAppendString(p, z, n);
      }
      break;
    }
    default: {
      if( p->bErr==0 ){
        sqlite3_result_error(p->pCtx, "JSON cannot hold BLOB values", -1);
        p->bErr = 2;
        jsonReset(p);
      }
      break;
    }
  }
}